

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconengine.cpp
# Opt level: O1

QPixmap * __thiscall
QAbstractFileIconEngine::scaledPixmap
          (QPixmap *__return_storage_ptr__,QAbstractFileIconEngine *this,QSize *size,Mode mode,
          State state,qreal scale)

{
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined7 extraout_var;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar12;
  undefined1 auVar11 [16];
  ulong local_a0;
  undefined1 local_98 [8];
  QPlatformPixmap *pQStack_90;
  QExplicitlySharedDataPointer<QPlatformPixmap> local_88;
  QStringBuilder<char16_t,_QString> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((size->wd).m_i < 0) || ((size->ht).m_i < 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00267e1d;
    QPixmap::QPixmap(__return_storage_ptr__);
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x11])(&local_58);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      dVar10 = scale * (double)(*size).wd.m_i;
      dVar12 = scale * (double)(*size).ht.m_i;
      auVar11._0_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
      auVar11._8_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
      auVar11 = minpd(_DAT_00684790,auVar11);
      auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
      auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
      uVar4 = movmskpd(iVar3,auVar9);
      uVar6 = 0x8000000000000000;
      if ((uVar4 & 2) != 0) {
        uVar6 = (ulong)(uint)(int)auVar11._8_8_ << 0x20;
      }
      uVar5 = 0x80000000;
      if ((uVar4 & 1) != 0) {
        uVar5 = (ulong)(uint)(int)auVar11._0_8_;
      }
      local_78._0_8_ = uVar5 | uVar6;
      (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                (__return_storage_ptr__,this,&local_78,(ulong)mode,state);
    }
    else {
      QString::number((double)(size->wd).m_i * scale,(char)local_98,0x67);
      local_78.b.d.size = (qsizetype)local_88.d.ptr;
      local_78.b.d.ptr = (char16_t *)pQStack_90;
      local_78.b.d.d = (Data *)local_98;
      local_78.a = 0x5f;
      local_98 = (undefined1  [8])0x0;
      pQStack_90 = (QPlatformPixmap *)0x0;
      local_88.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      ::operator+=(&local_58,&local_78);
      if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_98 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98,2,0x10);
        }
      }
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa
      ;
      QPixmap::QPixmap(__return_storage_ptr__);
      bVar2 = QPixmapCache::find(&local_58,__return_storage_ptr__);
      if (!bVar2) {
        dVar10 = scale * (double)(*size).wd.m_i;
        dVar12 = scale * (double)(*size).ht.m_i;
        auVar7._0_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
        auVar7._8_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
        auVar11 = minpd(_DAT_00684790,auVar7);
        auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
        auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
        uVar4 = movmskpd((int)CONCAT71(extraout_var,bVar2),auVar8);
        uVar6 = 0x8000000000000000;
        if ((uVar4 & 2) != 0) {
          uVar6 = (ulong)(uint)(int)auVar11._8_8_ << 0x20;
        }
        local_a0 = 0x80000000;
        if ((uVar4 & 1) != 0) {
          local_a0 = (ulong)(uint)(int)auVar11._0_8_;
        }
        local_a0 = local_a0 | uVar6;
        (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                  ((QPixmap *)local_98,this,&local_a0,(ulong)mode,state);
        local_78.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_78);
        QVar1.d.ptr = local_88.d.ptr;
        local_78._0_8_ = &PTR__QPixmap_007e3618;
        local_88.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
        local_78.b.d.ptr = (char16_t *)(__return_storage_ptr__->data).d.ptr;
        (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar1.d.ptr;
        QPixmap::~QPixmap((QPixmap *)&local_78);
        QPixmap::~QPixmap((QPixmap *)local_98);
        bVar2 = QPixmap::isNull(__return_storage_ptr__);
        if (!bVar2) {
          QPixmapCache::insert(&local_58,__return_storage_ptr__);
        }
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00267e1d:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPixmap QAbstractFileIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    if (!size.isValid())
        return QPixmap();

    QString key = cacheKey();
    if (key.isEmpty())
        return filePixmap(size * scale, mode, state);

    key += u'_' + QString::number(size.width() * scale);

    QPixmap result;
    if (!QPixmapCache::find(key, &result)) {
        result = filePixmap(size * scale, mode, state);
        if (!result.isNull())
            QPixmapCache::insert(key, result);
    }

    return result;
}